

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
anon_unknown.dwarf_705d06::EffectiveWidthVisitor::visit<slang::ast::OpenRangeExpression>
          (EffectiveWidthVisitor *this,OpenRangeExpression *expr)

{
  Type *this_00;
  bitwidth_t local_24;
  OpenRangeExpression *local_20;
  OpenRangeExpression *expr_local;
  EffectiveWidthVisitor *this_local;
  
  local_20 = expr;
  expr_local = (OpenRangeExpression *)this;
  this_00 = slang::not_null<const_slang::ast::Type_*>::operator->(&(expr->super_Expression).type);
  local_24 = slang::ast::Type::getBitWidth(this_00);
  std::optional<unsigned_int>::optional<unsigned_int,_true>
            ((optional<unsigned_int> *)&this_local,&local_24);
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)this_local;
}

Assistant:

std::optional<bitwidth_t> visit(const T& expr) {
        if constexpr (is_detected_v<getEffectiveWidth_t, T>) {
            if (expr.bad())
                return std::nullopt;

            return expr.getEffectiveWidthImpl();
        }
        else {
            return expr.type->getBitWidth();
        }
    }